

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::SingularFieldHelper<1>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  CodedOutputStream *in_RDX;
  void *in_RSI;
  
  WriteTagTo<google::protobuf::io::CodedOutputStream>((uint32)((ulong)in_RSI >> 0x20),in_RDX);
  SerializeTo<1,google::protobuf::io::CodedOutputStream>(in_RSI,in_RDX);
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeTo<type>(field, output);
  }